

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O3

void __thiscall helics::apps::Player::cleanUpPointList(Player *this)

{
  pointer pVVar1;
  pointer pMVar2;
  mapped_type *pmVar3;
  ValueSetter *vs;
  pointer pVVar4;
  MessageHolder *ms;
  pointer pMVar5;
  key_type local_38;
  
  pVVar4 = (this->points).
           super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar1 = (this->points).
           super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pVVar4 != pVVar1) {
    do {
      local_38._M_str = (pVVar4->pubName)._M_dataplus._M_p;
      local_38._M_len = (pVVar4->pubName)._M_string_length;
      pmVar3 = CLI::std::__detail::
               _Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->pubids,&local_38);
      pVVar4->index = *pmVar3;
      pVVar4 = pVVar4 + 1;
    } while (pVVar4 != pVVar1);
  }
  pMVar5 = (this->messages).
           super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar2 = (this->messages).
           super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar5 != pMVar2) {
    do {
      local_38._M_str = (pMVar5->mess).source._M_dataplus._M_p;
      local_38._M_len = (pMVar5->mess).source._M_string_length;
      pmVar3 = CLI::std::__detail::
               _Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->eptids,&local_38);
      pMVar5->index = *pmVar3;
      pMVar5 = pMVar5 + 1;
    } while (pMVar5 != pMVar2);
  }
  return;
}

Assistant:

void Player::cleanUpPointList()
{
    // load up the indexes
    for (auto& vs : points) {
        vs.index = pubids[vs.pubName];
    }
    /** load the indices for the message*/
    for (auto& ms : messages) {
        ms.index = eptids[ms.mess.source];
    }
}